

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void fmt::v10::detail::value<fmt::v10::basic_format_context<fmt::v10::appender,char>>::
     format_custom_arg<fmt::v10::detail::styled_arg<char[7]>,fmt::v10::formatter<fmt::v10::detail::styled_arg<char[7]>,char,void>>
               (void *arg,parse_context_type *parse_ctx,
               basic_format_context<fmt::v10::appender,_char> *ctx)

{
  char *it;
  iterator iVar1;
  formatter<fmt::v10::detail::styled_arg<char[7]>,_char,_void> f;
  dynamic_format_specs<char> local_68;
  
  local_68.precision_ref.val.name.data_ = (char *)0x0;
  local_68.precision_ref.val.name.size_ = 0;
  local_68.width_ref.val.name.size_ = 0;
  local_68.precision_ref.kind = none;
  local_68.precision_ref._4_4_ = 0;
  local_68.width_ref.kind = none;
  local_68.width_ref._4_4_ = 0;
  local_68.width_ref.val.name.data_ = (char *)0x0;
  local_68.super_format_specs<char>.width = 0;
  local_68.super_format_specs<char>.precision = 0;
  local_68.super_format_specs<char>.type = none;
  local_68.super_format_specs<char>._9_2_ = 0;
  local_68.super_format_specs<char>.fill.data_[0] = '\0';
  local_68.super_format_specs<char>.fill.data_[1] = '\0';
  local_68.super_format_specs<char>.fill.data_[2] = '\0';
  local_68.super_format_specs<char>.fill.data_[3] = '\0';
  local_68.super_format_specs<char>.fill.size_ = '\0';
  dynamic_format_specs<char>::dynamic_format_specs(&local_68);
  it = formatter<fmt::v10::basic_string_view<char>,char,void>::
       parse<fmt::v10::basic_format_parse_context<char>>
                 ((formatter<fmt::v10::basic_string_view<char>,char,void> *)&local_68,parse_ctx);
  basic_format_parse_context<char>::advance_to(parse_ctx,it);
  iVar1 = formatter<fmt::v10::detail::styled_arg<char[7]>,char,void>::
          format<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                    ((formatter<fmt::v10::detail::styled_arg<char[7]>,char,void> *)&local_68,
                     (styled_arg<char[7]> *)arg,ctx);
  (ctx->out_).super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
       (buffer<char> *)iVar1.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  return;
}

Assistant:

static void format_custom_arg(void* arg,
                                typename Context::parse_context_type& parse_ctx,
                                Context& ctx) {
    auto f = Formatter();
    parse_ctx.advance_to(f.parse(parse_ctx));
    using qualified_type =
        conditional_t<has_const_formatter<T, Context>(), const T, T>;
    ctx.advance_to(f.format(*static_cast<qualified_type*>(arg), ctx));
  }